

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O3

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::detail::
case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
::operator=(case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            *this,char ch)

{
  transform_op tVar1;
  long lVar2;
  
  tVar1 = this->next_;
  if (tVar1 == op_none) {
    tVar1 = this->rest_;
  }
  if (tVar1 == op_lower) {
    lVar2 = 0x10;
  }
  else {
    if (tVar1 != op_upper) goto LAB_0013e4f6;
    lVar2 = 0x18;
  }
  (**(code **)((long)this->traits_->_vptr_traits + lVar2))(this->traits_,(int)ch);
LAB_0013e4f6:
  std::__cxx11::string::push_back((char)(this->out_).container);
  return this;
}

Assistant:

case_converting_iterator &operator =(Char ch)
    {
        switch(this->next_ ? this->next_ : this->rest_)
        {
        case op_lower:
            ch = this->traits_->tolower(ch);
            break;

        case op_upper:
            ch = this->traits_->toupper(ch);
            break;

        default:;
        }

        *this->out_ = ch;
        return *this;
    }